

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O0

void __thiscall google::protobuf::internal::ThreadSafeArena::~ThreadSafeArena(ThreadSafeArena *this)

{
  bool bVar1;
  AllocationPolicy *policy;
  SizedPtr SVar2;
  GetDeallocator local_30;
  void *pvStack_28;
  SizedPtr mem;
  ThreadSafeArena *this_local;
  
  mem.n = (size_t)this;
  CleanupList(this);
  SVar2 = Free(this);
  mem.p = (void *)SVar2.n;
  pvStack_28 = SVar2.p;
  bVar1 = TaggedAllocationPolicyPtr::is_user_owned_initial_block(&this->alloc_policy_);
  if ((!bVar1) && (mem.p != (void *)0x0)) {
    policy = TaggedAllocationPolicyPtr::get(&this->alloc_policy_);
    anon_unknown_12::GetDeallocator::GetDeallocator(&local_30,policy);
    SVar2.n = (size_t)mem.p;
    SVar2.p = pvStack_28;
    anon_unknown_12::GetDeallocator::operator()(&local_30,SVar2);
  }
  absl::lts_20240722::Mutex::Dtor();
  return;
}

Assistant:

ThreadSafeArena::~ThreadSafeArena() {
  // Have to do this in a first pass, because some of the destructors might
  // refer to memory in other blocks.
  CleanupList();

  auto mem = Free();
  if (alloc_policy_.is_user_owned_initial_block()) {
    // Unpoison the initial block, now that it's going back to the user.
    PROTOBUF_UNPOISON_MEMORY_REGION(mem.p, mem.n);
  } else if (mem.n > 0) {
    GetDeallocator(alloc_policy_.get())(mem);
  }
}